

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address.cpp
# Opt level: O1

void cfd::js::api::ParseTapBranch
               (vector<cfd::js::api::TapScriptTreeItemStruct,_std::allocator<cfd::js::api::TapScriptTreeItemStruct>_>
                *list,TapBranch *branch,uint8_t depth)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  string past_branch_hash;
  TapScriptTreeItemStruct item;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> branches;
  TapScriptTreeItemStruct leaf_data;
  uint8_t local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  TapBranch *local_1b0;
  vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
  *local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  undefined1 local_188 [32];
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  int64_t local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_148;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  ulong local_100;
  void *local_f8 [3];
  long local_e0;
  long local_d8;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  ulong local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_1a8 = (vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
               *)list;
  cfd::core::TapBranch::GetBranchList();
  lVar8 = (local_d8 - local_e0 >> 3) * -0x1111111111111111;
  local_c0._M_p = (pointer)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0._M_p = (pointer)&local_90;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80 = 0;
  vStack_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar1 = (int)lVar8;
  iVar2 = (int)CONCAT71(in_register_00000011,depth);
  local_c8._0_4_ = iVar1 + iVar2;
  local_1b0 = branch;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::TapBranch::GetBaseHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_c0,(string *)local_198);
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
  if (local_198 != (undefined1  [8])__args) {
    operator_delete((void *)local_198);
  }
  if (local_1d0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  cVar4 = cfd::core::TapBranch::HasTapLeaf();
  if (cVar4 == '\0') {
    local_198 = (undefined1  [8])__args;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"tapscript","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    if (local_198 != (undefined1  [8])__args) {
      operator_delete((void *)local_198);
    }
    local_198 = (undefined1  [8])__args;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"leafVersion","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    if (local_198 != (undefined1  [8])__args) {
      operator_delete((void *)local_198);
    }
  }
  else {
    cfd::core::TapBranch::GetScript();
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    core::Script::~Script((Script *)local_198);
    bVar5 = cfd::core::TapBranch::GetLeafVersion();
    local_80 = (ulong)bVar5;
  }
  local_198 = (undefined1  [8])__args;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"relatedBranchHash","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
  if (local_198 != (undefined1  [8])__args) {
    operator_delete((void *)local_198);
  }
  std::
  vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
  ::emplace_back<cfd::js::api::TapScriptTreeItemStruct&>
            (local_1a8,(TapScriptTreeItemStruct *)local_c8);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_c0._M_p,local_c0._M_p + local_b8);
  if (iVar1 != 0) {
    local_100 = (ulong)(uint)-iVar1;
    local_1f1 = (char)lVar8 + depth;
    lVar8 = 0;
    uVar9 = 0;
    iVar1 = iVar1 + iVar2;
    do {
      lVar3 = local_e0;
      uVar7 = (local_d8 - local_e0 >> 3) * -0x1111111111111111;
      if (uVar7 < uVar9 || uVar7 - uVar9 == 0) {
        uVar6 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar9);
        if (local_198 != (undefined1  [8])__args) {
          operator_delete((void *)local_198);
        }
        TapScriptTreeItemStruct::~TapScriptTreeItemStruct((TapScriptTreeItemStruct *)local_c8);
        std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                  ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_e0)
        ;
        _Unwind_Resume(uVar6);
      }
      local_190._M_p = local_188 + 8;
      local_188._0_8_ = (pointer)0x0;
      local_188[8] = '\0';
      local_188._24_8_ = &local_160;
      local_168 = 0;
      local_160._M_local_buf[0] = '\0';
      local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vStack_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_150 = 0;
      vStack_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_130._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_130._M_impl.super__Rb_tree_header._M_header;
      local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_198 = (undefined1  [8])CONCAT44(local_198._4_4_,iVar1 + -1);
      local_19c = iVar1 + -1;
      local_130._M_impl.super__Rb_tree_header._M_header._M_right =
           local_130._M_impl.super__Rb_tree_header._M_header._M_left;
      cfd::core::TapBranch::GetBranchHash((uchar)local_f8);
      cfd::core::ByteData256::GetHex_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&local_190,(string *)&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if (local_f8[0] != (void *)0x0) {
        operator_delete(local_f8[0]);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_148,
                 &local_1d0);
      cfd::core::TapBranch::GetCurrentBranchHash();
      __args = &local_1f0;
      cfd::core::ByteData256::GetHex_abi_cxx11_();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_148,
                 __args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if (local_f8[0] != (void *)0x0) {
        operator_delete(local_f8[0]);
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"tapscript","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_130,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"leafVersion","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_130,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      std::
      vector<cfd::js::api::TapScriptTreeItemStruct,std::allocator<cfd::js::api::TapScriptTreeItemStruct>>
      ::emplace_back<cfd::js::api::TapScriptTreeItemStruct&>
                (local_1a8,(TapScriptTreeItemStruct *)local_198);
      std::__cxx11::string::_M_assign((string *)&local_1d0);
      ParseTapBranch((vector<cfd::js::api::TapScriptTreeItemStruct,_std::allocator<cfd::js::api::TapScriptTreeItemStruct>_>
                      *)local_1a8,(TapBranch *)(lVar3 + lVar8),local_1f1);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._24_8_ != &local_160) {
        operator_delete((void *)local_188._24_8_);
      }
      if (local_190._M_p != local_188 + 8) {
        operator_delete(local_190._M_p);
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x78;
      local_1f1 = local_1f1 + 0xff;
      iVar1 = local_19c;
    } while ((int)local_100 + (int)uVar9 != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p);
  }
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_e0);
  return;
}

Assistant:

static void ParseTapBranch(
    std::vector<TapScriptTreeItemStruct>* list, const TapBranch& branch,
    uint8_t depth) {
  auto branches = branch.GetBranchList();
  uint32_t branch_max = static_cast<uint32_t>(branches.size());
  TapScriptTreeItemStruct leaf_data;
  leaf_data.depth = branch_max + depth;
  leaf_data.tap_branch_hash = branch.GetBaseHash().GetHex();
  if (branch.HasTapLeaf()) {
    leaf_data.tapscript = branch.GetScript().GetHex();
    leaf_data.leaf_version = branch.GetLeafVersion();
  } else {
    leaf_data.ignore_items.insert("tapscript");
    leaf_data.ignore_items.insert("leafVersion");
  }
  leaf_data.ignore_items.insert("relatedBranchHash");
  list->emplace_back(leaf_data);

  std::string past_branch_hash = leaf_data.tap_branch_hash;
  for (uint32_t index = 0; index < branch_max; ++index) {
    uint32_t current_depth = branch_max - 1 - index + depth;
    auto& target_branch = branches.at(index);
    // set value (branch hash)
    TapScriptTreeItemStruct item;
    item.depth = current_depth;
    item.tap_branch_hash =
        branch.GetBranchHash(static_cast<uint8_t>(index)).GetHex();
    item.related_branch_hash.emplace_back(past_branch_hash);
    item.related_branch_hash.emplace_back(
        target_branch.GetCurrentBranchHash().GetHex());
    item.ignore_items.insert("tapscript");
    item.ignore_items.insert("leafVersion");
    list->emplace_back(item);
    past_branch_hash = item.tap_branch_hash;

    ParseTapBranch(list, target_branch, current_depth + 1);
  }
}